

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImDrawChannel * __thiscall
ImVector<ImDrawChannel>::insert(ImVector<ImDrawChannel> *this,ImDrawChannel *it,ImDrawChannel *v)

{
  undefined8 *puVar1;
  int iVar2;
  int new_capacity;
  undefined8 uVar3;
  ImDrawCmd *pIVar4;
  unsigned_short *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ImDrawChannel *pIVar10;
  
  pIVar10 = this->Data;
  if (pIVar10 <= it) {
    iVar2 = this->Size;
    lVar7 = (long)iVar2;
    if (it <= pIVar10 + lVar7) {
      lVar9 = (long)it - (long)pIVar10;
      if (iVar2 == this->Capacity) {
        if (iVar2 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar2 / 2 + iVar2;
        }
        new_capacity = iVar2 + 1;
        if (iVar2 + 1 < iVar6) {
          new_capacity = iVar6;
        }
        reserve(this,new_capacity);
        lVar7 = (long)this->Size;
        pIVar10 = this->Data;
      }
      lVar8 = lVar7 - (lVar9 >> 5);
      if (lVar8 != 0 && lVar9 >> 5 <= lVar7) {
        memmove((void *)((long)pIVar10 + lVar9 + 0x20),(void *)((long)pIVar10 + lVar9),lVar8 * 0x20)
        ;
        pIVar10 = this->Data;
      }
      uVar3 = *(undefined8 *)&v->_CmdBuffer;
      pIVar4 = (v->_CmdBuffer).Data;
      puVar5 = (v->_IdxBuffer).Data;
      puVar1 = (undefined8 *)((long)pIVar10 + lVar9 + 0x10);
      *puVar1 = *(undefined8 *)&v->_IdxBuffer;
      puVar1[1] = puVar5;
      *(undefined8 *)((long)pIVar10 + lVar9) = uVar3;
      ((undefined8 *)((long)pIVar10 + lVar9))[1] = pIVar4;
      this->Size = this->Size + 1;
      return (ImDrawChannel *)(lVar9 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,
                "T *ImVector<ImDrawChannel>::insert(const T *, const T &) [T = ImDrawChannel]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }